

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

bool __thiscall
BCLog::Logger::SetCategoryLogLevel(Logger *this,string_view category_str,string_view level_str)

{
  long lVar1;
  string_view str;
  bool bVar2;
  Level *pLVar3;
  mapped_type *pmVar4;
  size_t in_RDX;
  long in_FS_OFFSET;
  string_view in_stack_00000028;
  StdLockGuard scoped_lock;
  LogFlags flag;
  optional<BCLog::Level> level;
  optional<BCLog::Level> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Level LVar5;
  unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
  *in_stack_ffffffffffffff68;
  bool local_61;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = in_stack_ffffffffffffffc8;
  str._M_len = in_RDX;
  bVar2 = GetLogCategory((LogFlags *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         str);
  if (bVar2) {
    GetLogLevel(in_stack_00000028);
    bVar2 = std::optional<BCLog::Level>::has_value(in_stack_ffffffffffffff58);
    if ((bVar2) &&
       (pLVar3 = std::optional<BCLog::Level>::value
                           ((optional<BCLog::Level> *)in_stack_ffffffffffffff68), (int)*pLVar3 < 3))
    {
      StdLockGuard::StdLockGuard((StdLockGuard *)in_stack_ffffffffffffff58,(StdMutex *)0x1fe160);
      pLVar3 = std::optional<BCLog::Level>::value
                         ((optional<BCLog::Level> *)in_stack_ffffffffffffff68);
      LVar5 = *pLVar3;
      pmVar4 = std::
               unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
               ::operator[](in_stack_ffffffffffffff68,
                            (key_type *)CONCAT44(LVar5,in_stack_ffffffffffffff60));
      *pmVar4 = LVar5;
      local_61 = true;
      StdLockGuard::~StdLockGuard((StdLockGuard *)in_stack_ffffffffffffff58);
    }
    else {
      local_61 = false;
    }
  }
  else {
    local_61 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool BCLog::Logger::SetCategoryLogLevel(std::string_view category_str, std::string_view level_str)
{
    BCLog::LogFlags flag;
    if (!GetLogCategory(flag, category_str)) return false;

    const auto level = GetLogLevel(level_str);
    if (!level.has_value() || level.value() > MAX_USER_SETABLE_SEVERITY_LEVEL) return false;

    StdLockGuard scoped_lock(m_cs);
    m_category_log_levels[flag] = level.value();
    return true;
}